

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_servergreet_resp(Curl_easy *data,int imapcode,imapstate instate)

{
  connectdata *conn_00;
  CURLcode CVar1;
  imap_conn *imapc;
  connectdata *conn;
  imapstate instate_local;
  int imapcode_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (imapcode == 3) {
    *(byte *)((long)&conn_00->proto + 0xfb) = *(byte *)((long)&conn_00->proto + 0xfb) & 0xfd | 2;
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"PREAUTH connection, already authenticated");
    }
  }
  else if (imapcode != 1) {
    Curl_failf(data,"Got unexpected imap-server response");
    return CURLE_WEIRD_SERVER_REPLY;
  }
  CVar1 = imap_perform_capability(data,conn_00);
  return CVar1;
}

Assistant:

static CURLcode imap_state_servergreet_resp(struct Curl_easy *data,
                                            int imapcode,
                                            imapstate instate)
{
  struct connectdata *conn = data->conn;
  (void)instate; /* no use for this yet */

  if(imapcode == IMAP_RESP_PREAUTH) {
    /* PREAUTH */
    struct imap_conn *imapc = &conn->proto.imapc;
    imapc->preauth = TRUE;
    infof(data, "PREAUTH connection, already authenticated");
  }
  else if(imapcode != IMAP_RESP_OK) {
    failf(data, "Got unexpected imap-server response");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  return imap_perform_capability(data, conn);
}